

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Hinge::backward_impl
          (Hinge *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  Scalar *pSVar5;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  Dim *in_R9;
  undefined1 auVar6 [64];
  uint i_1;
  uint tne;
  float *eloss;
  uint rows;
  float d;
  Index in_stack_ffffffffffffff78;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *in_stack_ffffffffffffff80;
  Tensor *in_stack_ffffffffffffff98;
  uint local_48;
  int local_44;
  
  if (in_R8D != 0) {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x4ea,
                  "virtual void cnn::Hinge::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  if ((**(float **)(in_RDX + 0x28) != 0.0) || (NAN(**(float **)(in_RDX + 0x28)))) {
    fVar1 = **(float **)(in_RCX + 0x28);
    uVar4 = Dim::rows(in_R9);
    lVar2 = *(long *)(in_RDI + 0x48);
    local_44 = 0;
    for (local_48 = 0; local_48 < uVar4; local_48 = local_48 + 1) {
      auVar6 = ZEXT1664((undefined1  [16])0x0);
      if (0.0 < *(float *)(lVar2 + (ulong)local_48 * 4)) {
        Tensor::operator*(in_stack_ffffffffffffff98);
        pSVar5 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        *pSVar5 = fVar1 + *pSVar5;
        local_44 = local_44 + 1;
      }
    }
    auVar3 = vcvtusi2ss_avx512f(auVar6._0_16_,local_44);
    Tensor::operator*(in_stack_ffffffffffffff98);
    pSVar5 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    *pSVar5 = *pSVar5 - fVar1 * auVar3._0_4_;
  }
  return;
}

Assistant:

void Hinge::backward_impl(const vector<const Tensor*>& xs,
                       const Tensor& fx,
                       const Tensor& dEdf,
                       unsigned i,
                       Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("Hinge not yet implemented for CUDA");
#else
  if (fx.v[0]) { // there was some loss
    const float d = dEdf.v[0];
    const unsigned rows = dEdxi.d.rows();
    const float* eloss = static_cast<const float*>(aux_mem);
    unsigned tne = 0;  // total number of errors
    for (unsigned i = 0; i < rows; ++i)
      if (eloss[i] > 0) {
        (*dEdxi)(i) += d;
        ++tne;
      }
    (*dEdxi)(*pelement) -= d * tne;
  }
#endif
}